

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_NtkWriteFlopDependency(Abc_Ntk_t *pNtk,char *pFileName)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  uint local_44;
  int local_40;
  int Count;
  int k;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  FILE *pFile;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  pFile = (FILE *)pFileName;
  pFileName_local = (char *)pNtk;
  __stream = fopen(pFileName,"w");
  vSupp = (Vec_Ptr_t *)__stream;
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file %s.\n",pFile);
  }
  else {
    pcVar2 = Abc_NtkName((Abc_Ntk_t *)pFileName_local);
    pcVar3 = Extra_TimeStamp();
    fprintf(__stream,"# Flop dependency for \"%s\" generated by ABC on %s\n",pcVar2,pcVar3);
    fprintf((FILE *)vSupp,"digraph G {\n");
    fprintf((FILE *)vSupp,"  graph [splines=true overlap=false];\n");
    fprintf((FILE *)vSupp,"  size = \"7.5,10\";\n");
    fprintf((FILE *)vSupp,"  center = true;\n");
    fprintf((FILE *)vSupp,"  edge [dir=forward];\n");
    for (Count = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(pFileName_local + 0x50)), Count < iVar1;
        Count = Count + 1) {
      pAVar4 = Abc_NtkBox((Abc_Ntk_t *)pFileName_local,Count);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        pAVar4 = Abc_NtkBox((Abc_Ntk_t *)pFileName_local,Count);
        pTemp = Abc_ObjFanin0(pAVar4);
        pAVar4 = Abc_ObjFanout0(pTemp);
        pAVar4 = Abc_ObjFanout0(pAVar4);
        (pAVar4->field_6).iTemp = Count;
        pObj = (Abc_Obj_t *)Abc_NtkNodeSupport((Abc_Ntk_t *)pFileName_local,&pTemp,1);
        local_44 = 0;
        for (local_40 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_40 < iVar1;
            local_40 = local_40 + 1) {
          pAVar4 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_40);
          iVar1 = Abc_ObjIsPi(pAVar4);
          local_44 = iVar1 + local_44;
        }
        Vec_PtrFree((Vec_Ptr_t *)pObj);
        fprintf((FILE *)vSupp,"  { rank = same; %d [label=\"%d(%d)\"]; }\n",(ulong)(uint)Count,
                (ulong)(uint)Count,(ulong)local_44);
      }
    }
    for (Count = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(pFileName_local + 0x50)), Count < iVar1;
        Count = Count + 1) {
      pAVar4 = Abc_NtkBox((Abc_Ntk_t *)pFileName_local,Count);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        pAVar4 = Abc_NtkBox((Abc_Ntk_t *)pFileName_local,Count);
        pTemp = Abc_ObjFanin0(pAVar4);
        pObj = (Abc_Obj_t *)Abc_NtkNodeSupport((Abc_Ntk_t *)pFileName_local,&pTemp,1);
        for (local_40 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_40 < iVar1;
            local_40 = local_40 + 1) {
          pAVar4 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_40);
          iVar1 = Abc_ObjIsPi(pAVar4);
          if (iVar1 == 0) {
            fprintf((FILE *)vSupp,"  %4d -> %4d\n",(ulong)(uint)(pAVar4->field_6).iTemp,
                    (ulong)(uint)Count);
          }
        }
        Vec_PtrFree((Vec_Ptr_t *)pObj);
      }
    }
    fprintf((FILE *)vSupp,"}\n");
    fclose((FILE *)vSupp);
  }
  return;
}

Assistant:

void Abc_NtkWriteFlopDependency( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, Count;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file %s.\n", pFileName );
        return;
    }
    fprintf( pFile, "# Flop dependency for \"%s\" generated by ABC on %s\n", Abc_NtkName(pNtk), Extra_TimeStamp() );
    fprintf( pFile, "digraph G {\n" );
    fprintf( pFile, "  graph [splines=true overlap=false];\n" );
    fprintf( pFile, "  size = \"7.5,10\";\n" );
    fprintf( pFile, "  center = true;\n" );
//    fprintf( pFile, "  edge [len=3,dir=forward];\n" );
    fprintf( pFile, "  edge [dir=forward];\n" );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Abc_ObjFanout0( Abc_ObjFanout0(pObj) )->iTemp = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Count += Abc_ObjIsPi(pTemp);
        Vec_PtrFree( vSupp );
        fprintf( pFile, "  { rank = same; %d [label=\"%d(%d)\"]; }\n", i, i, Count );
    }
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Count = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            if ( !Abc_ObjIsPi(pTemp) )
                fprintf( pFile, "  %4d -> %4d\n", pTemp->iTemp, i );
        Vec_PtrFree( vSupp );
    }
    fprintf( pFile, "}\n" );
    fclose( pFile );
}